

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

size_t google::protobuf::internal::VarintSize<false,true,int>(int *data,int n)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  uint32_t sum;
  
  if (n < 1) {
    iVar4 = 0;
  }
  else {
    uVar2 = (ulong)(uint)n;
    uVar3 = 0;
    iVar4 = 0;
    do {
      uVar1 = data[uVar3];
      iVar4 = iVar4 - ((int)uVar1 >> 0x1f);
      n = (((((uint)(0x7f < uVar1) + n) - (uint)(uVar1 < 0x4000)) - (uint)(uVar1 < 0x200000)) + 3) -
          (uint)(uVar1 < 0x10000000);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
    iVar4 = iVar4 * 5;
  }
  return (ulong)(uint)(iVar4 + n);
}

Assistant:

static size_t VarintSize(const T* data, const int n) {
  static_assert(sizeof(T) == 4, "This routine only works for 32 bit integers");
  // is_unsigned<T> => !ZigZag
  static_assert(
      (std::is_unsigned<T>::value ^ ZigZag) || std::is_signed<T>::value,
      "Cannot ZigZag encode unsigned types");
  // is_unsigned<T> => !SignExtended
  static_assert(
      (std::is_unsigned<T>::value ^ SignExtended) || std::is_signed<T>::value,
      "Cannot SignExtended unsigned types");
  static_assert(!(SignExtended && ZigZag),
                "Cannot SignExtended and ZigZag on the same type");
  uint32_t sum = n;
  uint32_t msb_sum = 0;
  for (int i = 0; i < n; i++) {
    uint32_t x = data[i];
    if (ZigZag) {
      x = WireFormatLite::ZigZagEncode32(x);
    } else if (SignExtended) {
      msb_sum += x >> 31;
    }
    // clang is so smart that it produces optimal SSE sequence unrolling
    // the loop 8 ints at a time. With a sequence of 4
    // cmpres = cmpgt x, sizeclass  ( -1 or 0)
    // sum = sum - cmpres
    if (x > 0x7F) sum++;
    if (x > 0x3FFF) sum++;
    if (x > 0x1FFFFF) sum++;
    if (x > 0xFFFFFFF) sum++;
  }
  if (SignExtended) sum += msb_sum * 5;
  return sum;
}